

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O2

BBox<3> * Omega_h::get_bounding_box<3>(BBox<3> *__return_storage_ptr__,Mesh *mesh)

{
  long lVar1;
  double dVar2;
  Comm *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  
  Mesh::coords((Mesh *)&stack0xffffffffffffffc0);
  find_bounding_box<3>(__return_storage_ptr__,(Reals *)&stack0xffffffffffffffc0);
  Write<double>::~Write((Write<double> *)&stack0xffffffffffffffc0);
  for (lVar1 = -0x18; lVar1 != 0; lVar1 = lVar1 + 8) {
    Mesh::comm((Mesh *)&local_50);
    dVar2 = Comm::allreduce<double>
                      (local_50,*(double *)
                                 ((long)(__return_storage_ptr__->max).super_Few<double,_3>.array_ +
                                 lVar1),OMEGA_H_MIN);
    *(double *)((long)(__return_storage_ptr__->max).super_Few<double,_3>.array_ + lVar1) = dVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    Mesh::comm((Mesh *)&local_50);
    dVar2 = Comm::allreduce<double>
                      (local_50,*(double *)
                                 ((long)__return_storage_ptr__[1].min.super_Few<double,_3>.array_ +
                                 lVar1),OMEGA_H_MAX);
    *(double *)((long)__return_storage_ptr__[1].min.super_Few<double,_3>.array_ + lVar1) = dVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox<dim> get_bounding_box(Mesh* mesh) {
  auto bb = find_bounding_box<dim>(mesh->coords());
  for (Int i = 0; i < dim; ++i) {
    bb.min[i] = mesh->comm()->allreduce(bb.min[i], OMEGA_H_MIN);
    bb.max[i] = mesh->comm()->allreduce(bb.max[i], OMEGA_H_MAX);
  }
  return bb;
}